

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

ptr __thiscall ThreadPool::threadfun(ThreadPool *this,ptr *arg)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *this_00;
  ptr pVar3;
  SP_Appender appender;
  queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
  appenders;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
  local_70;
  
  this_00 = (arg->super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_enable_shared_from_this<ThreadPool>)._M_weak_this.
  super___weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  p_Var1 = (arg->super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->super_enable_shared_from_this<ThreadPool>)._M_weak_this.
  super___weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      this_00 = (this->super_enable_shared_from_this<ThreadPool>)._M_weak_this.
                super___weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00->m_isRunning == true) {
    do {
      take(&local_70,this_00);
      while (local_70.c.
             super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_70.c.
             super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        peVar2 = ((local_70.c.
                   super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                 super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_80,
                   &((local_70.c.
                      super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                    super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>::
        pop_front(&local_70.c);
        (**peVar2->_vptr_Appender)();
      }
      std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>::~deque
                (&local_70.c);
    } while (this_00->m_isRunning != false);
    in_RDX._M_pi = extraout_RDX;
    if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  pVar3.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  pVar3.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr)pVar3.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ThreadPool::ptr ThreadPool::threadfun(ThreadPool::ptr arg)
{
	ThreadPool::ptr pool = static_cast<ThreadPool::ptr>(arg);
	SP_Appender appender=nullptr;
	while (pool->m_isRunning) {
		std::queue<SP_Appender> appenders= pool->take();
		while(!appenders.empty()) {
			appender=appenders.front();
			appenders.pop();
			appender->append();
		}
	}
	return pool;
}